

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall netbase_tests::caddress_serialize_v2::test_method(caddress_serialize_v2 *this)

{
  Span<const_std::byte> s_00;
  bool bVar1;
  long in_FS_OFFSET;
  ParamsWrapper<CAddress::SerParams,_const_std::vector<CAddress,_std::allocator<CAddress>_>_> PVar2;
  DataStream s;
  char *in_stack_fffffffffffffee8;
  undefined **in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  lazy_ostream *in_stack_ffffffffffffff10;
  size_t line_num;
  undefined1 local_a8 [16];
  undefined1 local_98 [64];
  ParamsWrapper<CAddress::SerParams,_const_std::vector<CAddress,_std::allocator<CAddress>_>_>
  local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffee8);
  PVar2 = CAddress::SerParams::operator()
                    ((SerParams *)in_stack_fffffffffffffef8,
                     (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffef0);
  local_58 = PVar2;
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffef8,
             (ParamsWrapper<CAddress::SerParams,_const_std::vector<CAddress,_std::allocator<CAddress>_>_>
              *)in_stack_fffffffffffffef0);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffef8,
               (pointer)in_stack_fffffffffffffef0,(unsigned_long)in_stack_fffffffffffffee8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffee8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)PVar2.m_params,(const_string *)PVar2.m_object,line_num,
               (const_string *)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff10 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffef0,(char (*) [1])in_stack_fffffffffffffee8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffef8,
               (pointer)in_stack_fffffffffffffef0,(unsigned_long)in_stack_fffffffffffffee8);
    Span<const_std::byte>::Span<DataStream>
              ((Span<const_std::byte> *)in_stack_fffffffffffffef8,
               (DataStream *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    s_00.m_size = line_num;
    s_00.m_data = (byte *)in_stack_ffffffffffffff10;
    HexStr_abi_cxx11_(s_00);
    in_stack_fffffffffffffef8 = "stream_addrv2_hex";
    in_stack_fffffffffffffef0 = &stream_addrv2_hex;
    in_stack_fffffffffffffee8 = "HexStr(s)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char_const*>
              (local_98,local_a8,0x248,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffee8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffee8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddress_serialize_v2)
{
    DataStream s{};

    s << CAddress::V2_NETWORK(fixture_addresses);
    BOOST_CHECK_EQUAL(HexStr(s), stream_addrv2_hex);
}